

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

void __thiscall
FastPForLib::Simple16<false>::fakeencodeArray
          (Simple16<false> *this,uint32_t *in,size_t length,size_t *nvalue)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (length == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      uVar2 = 0x1c;
      if (length < 0x1c) {
        uVar2 = length;
      }
      if (*in < 2) {
        uVar4 = 1;
        do {
          uVar3 = uVar4;
          if (uVar2 == uVar3) break;
          uVar4 = uVar3 + 1;
        } while (in[uVar3] < 2);
        if (uVar3 < uVar2) goto LAB_00125089;
      }
      else {
LAB_00125089:
        bVar1 = tryme<7u,2u,14u,1u>(in,length);
        if (((bVar1) || (bVar1 = tryme<7u,1u,7u,2u,7u,1u>(in,length), bVar1)) ||
           (bVar1 = tryme<14u,1u,7u,2u>(in,length), bVar1)) {
          bVar1 = length < 0x15;
          uVar2 = 0x15;
        }
        else {
          uVar2 = 0xe;
          if (length < 0xe) {
            uVar2 = length;
          }
          if (*in < 4) {
            uVar4 = 1;
            do {
              uVar3 = uVar4;
              if (uVar2 == uVar3) break;
              uVar4 = uVar3 + 1;
            } while (in[uVar3] < 4);
            if (uVar2 <= uVar3) goto LAB_001250c3;
          }
          bVar1 = tryme<1u,4u,8u,3u>(in,length);
          if (bVar1) {
            bVar1 = length < 9;
            uVar2 = 9;
          }
          else {
            bVar1 = tryme<1u,3u,4u,4u,3u,3u>(in,length);
            if (bVar1) {
              bVar1 = length < 8;
              uVar2 = 8;
            }
            else {
              uVar2 = 7;
              if (length < 7) {
                uVar2 = length;
              }
              if (*in < 0x10) {
                uVar4 = 1;
                do {
                  uVar3 = uVar4;
                  if (uVar2 == uVar3) break;
                  uVar4 = uVar3 + 1;
                } while (in[uVar3] < 0x10);
                if (uVar2 <= uVar3) goto LAB_001250c3;
              }
              bVar1 = tryme<4u,5u,2u,4u>(in,length);
              if ((bVar1) || (bVar1 = tryme<2u,4u,4u,5u>(in,length), bVar1)) {
                bVar1 = length < 6;
                uVar2 = 6;
              }
              else {
                bVar1 = tryme<3u,6u,2u,5u>(in,length);
                if ((bVar1) || (bVar1 = tryme<2u,5u,3u,6u>(in,length), bVar1)) {
                  bVar1 = length < 5;
                  uVar2 = 5;
                }
                else {
                  uVar2 = 4;
                  if (length < 4) {
                    uVar2 = length;
                  }
                  if (*in < 0x80) {
                    uVar4 = 1;
                    do {
                      uVar3 = uVar4;
                      if (uVar2 == uVar3) break;
                      uVar4 = uVar3 + 1;
                    } while (in[uVar3] < 0x80);
                    if (uVar2 <= uVar3) goto LAB_001250c3;
                  }
                  bVar1 = tryme<1u,10u,2u,9u>(in,length);
                  if (!bVar1) {
                    uVar2 = 1;
                    if (*in < 0x4000) {
                      uVar4 = 2;
                      if (length < 2) {
                        uVar4 = length;
                      }
                      do {
                        uVar3 = uVar2;
                        if (uVar4 == uVar3) break;
                        uVar2 = uVar3 + 1;
                      } while (in[uVar3] < 0x4000);
                      uVar2 = 1;
                      if (uVar4 <= uVar3) {
                        uVar2 = (ulong)(length != 1) + 1;
                      }
                    }
                    goto LAB_001250c3;
                  }
                  bVar1 = length < 3;
                  uVar2 = 3;
                }
              }
            }
          }
        }
        if (bVar1) {
          uVar2 = length;
        }
      }
LAB_001250c3:
      in = in + uVar2;
      sVar5 = sVar5 + 1;
      length = length - uVar2;
    } while (length != 0);
  }
  *nvalue = sVar5;
  return;
}

Assistant:

void Simple16<MarkLength>::fakeencodeArray(const uint32_t *in,
                                           const size_t length,
                                           size_t &nvalue) {
  uint32_t NumberOfValuesCoded = 0;
  size_t writtenout = 0;
  size_t ValuesRemaining(length);
  while (ValuesRemaining > 0) {
    if (tryme<28, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 28) ? static_cast<uint32_t>(ValuesRemaining) : 28;
    } else if (tryme<7, 2, 14, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 7 + 14)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 7 + 14;
    } else if (tryme<7, 1, 7, 2, 7, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 7 * 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 7 * 3;
    } else if (tryme<14, 1, 7, 2>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 14 + 7)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 14 + 7;
    } else if (tryme<14, 2>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 14) ? static_cast<uint32_t>(ValuesRemaining) : 14;
    } else if (tryme<1, 4, 8, 3>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 9) ? static_cast<uint32_t>(ValuesRemaining) : 9;
    } else if (tryme<1, 3, 4, 4, 3, 3>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 1 + 4 + 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 1 + 4 + 3;
    } else if (tryme<7, 4>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 7) ? static_cast<uint32_t>(ValuesRemaining) : 7;
    } else if (tryme<4, 5, 2, 4>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 4 + 2)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 4 + 2;
    } else if (tryme<2, 4, 4, 5>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 2 + 4)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 2 + 4;
    } else if (tryme<3, 6, 2, 5>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 3 + 2)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 3 + 2;
    } else if (tryme<2, 5, 3, 6>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 2 + 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 2 + 3;
    } else if (tryme<4, 7>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 4) ? static_cast<uint32_t>(ValuesRemaining) : 4;
    } else if (tryme<1, 10, 2, 9>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 3) ? static_cast<uint32_t>(ValuesRemaining) : 3;
    } else if (tryme<2, 14>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 2) ? static_cast<uint32_t>(ValuesRemaining) : 2;
    } else {
      NumberOfValuesCoded = 1;
    }
    in += NumberOfValuesCoded;
    ValuesRemaining -= NumberOfValuesCoded;
    ++writtenout;
  }
  nvalue = writtenout;
}